

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

bool __thiscall LinkedObjectFile::is_string(LinkedObjectFile *this,int seg,int byte_idx)

{
  bool bVar1;
  reference this_00;
  size_type sVar2;
  reference pvVar3;
  int in_EDX;
  value_type *type_word;
  int type_tag_ptr;
  char *in_stack_ffffffffffffffb8;
  uint7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  if ((in_EDX % 4 == 0) && (-1 < in_EDX + -4)) {
    this_00 = std::
              vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
              ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                   (size_type)in_stack_ffffffffffffffb8);
    sVar2 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::size(this_00);
    if ((ulong)(long)(in_EDX + -4) < sVar2 << 2) {
      std::
      vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
      ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
            *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
           (size_type)in_stack_ffffffffffffffb8);
      pvVar3 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                         ((vector<LinkedWord,_std::allocator<LinkedWord>_> *)
                          CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                          (size_type)in_stack_ffffffffffffffb8);
      if (pvVar3->kind == TYPE_PTR) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        return bVar1;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool LinkedObjectFile::is_string(int seg, int byte_idx) {
  if (byte_idx % 4) {
    return false;  // must be aligned pointer.
  }
  int type_tag_ptr = byte_idx - 4;
  // must fit in segment
  if (type_tag_ptr < 0 || size_t(type_tag_ptr) >= words_by_seg.at(seg).size() * 4) {
    return false;
  }
  auto& type_word = words_by_seg.at(seg).at(type_tag_ptr / 4);
  return type_word.kind == LinkedWord::TYPE_PTR && type_word.symbol_name == "string";
}